

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_disk_io.cpp
# Opt level: O3

void __thiscall
libtorrent::posix_disk_io::async_move_storage
          (posix_disk_io *this,storage_index_t storage,string *p,move_flags_t flags,
          function<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_libtorrent::storage_error_&)>
          *handler)

{
  io_context *piVar1;
  _Manager_type p_Var2;
  pointer pcVar3;
  undefined1 uVar4;
  storage_error ec;
  undefined1 local_b8 [16];
  _Manager_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  error_code local_70 [2];
  storage_error local_50;
  io_context *local_38;
  undefined4 local_2c;
  
  local_50.ec.val_ = 0;
  local_50.ec._4_4_ = local_50.ec._4_4_ & 0xffffff00;
  local_50.ec.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  local_50._16_3_ = 0xffffff;
  local_50.operation = unknown;
  aux::posix_storage::move_storage
            ((pair<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_b8,
             (posix_storage *)
             (this->m_torrents).
             super_vector<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>
             .
             super__Vector_base<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[storage.m_val]._M_t.
             super___uniq_ptr_impl<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
             ,p,flags,&local_50);
  uVar4 = local_b8[0];
  ::std::__cxx11::string::operator=((string *)p,(string *)(local_b8 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._8_8_ != &local_a0) {
    operator_delete((void *)local_b8._8_8_,local_a0._M_allocated_capacity + 1);
  }
  piVar1 = this->m_ios;
  local_b8._0_8_ = (void *)0x0;
  local_b8._8_8_ = (pointer)0x0;
  local_a8 = (_Manager_type)0x0;
  local_a0._M_allocated_capacity = (size_type)handler->_M_invoker;
  p_Var2 = (handler->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_b8._0_8_ = *(undefined8 *)&(handler->super__Function_base)._M_functor;
    local_b8._8_8_ = *(undefined8 *)((long)&(handler->super__Function_base)._M_functor + 8);
    (handler->super__Function_base)._M_manager = (_Manager_type)0x0;
    handler->_M_invoker = (_Invoker_type)0x0;
    local_a8 = p_Var2;
  }
  local_a0._M_local_buf[8] = uVar4;
  pcVar3 = (p->_M_dataplus)._M_p;
  local_90._M_p = (pointer)&local_80;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar3,pcVar3 + p->_M_string_length);
  local_70[1].val_ = local_50._16_4_;
  local_70[0].failed_ = local_50.ec.failed_;
  local_70[0]._5_3_ = local_50.ec._5_3_;
  local_70[0].val_ = local_50.ec.val_;
  local_70[0].cat_ = local_50.ec.cat_;
  local_2c = 1;
  local_38 = piVar1;
  boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
  execute<libtorrent::posix_disk_io::async_move_storage(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,std::__cxx11::string,libtorrent::move_flags_t,std::function<void(libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>,std::__cxx11::string_const&,libtorrent::storage_error_const&)>)::_lambda()_1_>
            ((basic_executor_type<std::allocator<void>,0u> *)&local_38,(type *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != &local_80) {
    operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
  }
  if (local_a8 != (_Manager_type)0x0) {
    (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
  }
  return;
}

Assistant:

void async_move_storage(storage_index_t const storage, std::string p
			, move_flags_t const flags
			, std::function<void(status_t, std::string const&, storage_error const&)> handler) override
		{
			posix_storage* st = m_torrents[storage].get();
			storage_error ec;
			status_t ret;
			std::tie(ret, p) = st->move_storage(p, flags, ec);
			post(m_ios, [=, h = std::move(handler)]{ h(ret, p, ec); });
		}